

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhosgPNGConv.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  Image local_60;
  Image img;
  
  if (argc < 2) {
    filename = (char *)0x0;
    filename_00 = (char *)0x0;
  }
  else {
    filename_00 = argv[1];
    if (argc == 2) {
      filename = (char *)0x0;
    }
    else {
      if (3 < (uint)argc) {
        fwrite("too many positional arguments given\n",0x24,1,_stderr);
        return 1;
      }
      filename = argv[2];
    }
  }
  phosg::Image::Image(&img);
  if ((filename_00 == (char *)0x0) || ((*filename_00 == '-' && (filename_00[1] == '\0')))) {
    phosg::Image::Image(&local_60,_stdin);
    phosg::Image::operator=(&img,&local_60);
  }
  else {
    phosg::Image::Image(&local_60,filename_00);
    phosg::Image::operator=(&img,&local_60);
  }
  phosg::Image::~Image(&local_60);
  if ((filename == (char *)0x0) || ((*filename == '-' && (filename[1] == '\0')))) {
    phosg::Image::save(&img,_stdout,PNG);
  }
  else {
    phosg::Image::save(&img,filename,PNG);
  }
  phosg::Image::~Image(&img);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  Image img;
  if (!src_filename || !strcmp(src_filename, "-")) {
    img = Image(stdin);
  } else {
    img = Image(src_filename);
  }

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    img.save(stdout, Image::Format::PNG);
  } else {
    img.save(dst_filename, Image::Format::PNG);
  }

  return 0;
}